

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O3

void CompiledMixedType<long_long,short>(void)

{
  int64_t a;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar1;
  int64_t tmp;
  int64_t u1;
  int64_t tmp_1;
  int64_t local_50;
  short local_42;
  int64_t local_40;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_38;
  
  local_50 = 0;
  LargeIntRegMultiply<long,int>::
  RegMultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (0,0,&local_50);
  local_50 = 0;
  local_40 = 0;
  local_38.m_int = 0;
  LargeIntRegMultiply<long,long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_50,&local_40,&local_38.m_int);
  local_50 = 0;
  LargeIntRegMultiply<long,int>::
  RegMultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (0,0,&local_50);
  local_50 = 0;
  LargeIntRegMultiply<long,int>::
  RegMultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (0,0,&local_50);
  a = local_50;
  local_50 = 0;
  LargeIntRegMultiply<long,int>::
  RegMultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (a,0,&local_50);
  local_38.m_int = 1;
  local_40 = CONCAT62(local_40._2_6_,1);
  local_50 = 0;
  DivisionHelper<long_long,short,5>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ((longlong *)&local_38,(short *)&local_40,&local_50);
  local_50 = 0;
  local_40 = 1;
  DivisionHelper<long_long,long_long,5>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ((longlong *)&local_38,&local_40,&local_50);
  operator/(1,local_38);
  local_50._0_2_ = 1;
  DivisionHelper<long_long,short,5>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ((longlong *)&local_38,(short *)&local_50,(longlong *)&local_38);
  local_50 = CONCAT62(local_50._2_6_,1);
  DivisionHelper<long_long,short,5>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ((longlong *)&local_38,(short *)&local_50,(longlong *)&local_38);
  local_40 = CONCAT62(local_40._2_6_,1);
  local_50 = 0;
  AdditionHelper<long_long,short,10>::
  AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ((longlong *)&local_38,(short *)&local_40,&local_50);
  local_50 = 0;
  local_40 = 1;
  AdditionHelper<long_long,long_long,10>::
  AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ((longlong *)&local_38,&local_40,&local_50);
  local_42 = 1;
  local_50 = 0;
  local_40 = local_38.m_int;
  AdditionHelper<long_long,short,10>::
  AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_40,&local_42,&local_50);
  local_50._0_2_ = 1;
  AdditionHelper<long_long,short,10>::
  AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ((longlong *)&local_38,(short *)&local_50,(longlong *)&local_38);
  local_50 = CONCAT62(local_50._2_6_,1);
  AdditionHelper<long_long,short,10>::
  AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ((longlong *)&local_38,(short *)&local_50,(longlong *)&local_38);
  local_38.m_int = 0;
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
             *)&local_38,0);
  local_50 = local_38.m_int;
  local_42 = 0;
  local_40 = 0;
  SubtractionHelper<short,long_long,18>::
  SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_42,&local_50,&local_40);
  local_38.m_int = 0;
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              *)&local_38,1);
  SVar1 = SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
          operator<<((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                      *)&local_38,
                     (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      )0x1);
  operator<<(SVar1.m_int,
             (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             )0x1);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<=((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&local_38,1);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<=((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&local_38,
              (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )0x1);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              *)&local_38,1);
  SVar1 = SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
          operator>>((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                      *)&local_38,
                     (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      )0x1);
  operator>>(SVar1.m_int,
             (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             )0x1);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>=((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&local_38,1);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>=((SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&local_38,
              (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )0x1);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}